

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O1

void __thiscall
compiler::CompilerAstWalker::onExitWhileStatementAstNode
          (CompilerAstWalker *this,WhileStatementAstNode *param_1)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer *ppuVar2;
  element_type *peVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  _Hash_node_base *p_Var7;
  ulong uVar8;
  pointer pBVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  undefined8 uVar11;
  _func_int **pp_Var12;
  ulong uVar13;
  _func_int **pp_Var14;
  _Hash_node_base *p_Var15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  __node_base_ptr p_Var17;
  __node_base_ptr p_Var18;
  _func_int **pp_Var19;
  ByteCode bc;
  undefined1 auStack_48 [8];
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> vec;
  
  peVar3 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar4 = (peVar3->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (peVar3->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  p_Var1 = &vec.
            super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  auStack_48 = (undefined1  [8])p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_48,
             "onExitWhileStatementAstNode encountered while exit statement but loopStartIndices is empty"
             ,"");
  Error::assertWithPanic(puVar4 != puVar5,(string *)auStack_48);
  if (auStack_48 != (undefined1  [8])p_Var1) {
    operator_delete((void *)auStack_48,
                    (ulong)((long)&(vec.
                                    super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  peVar3 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar4 = (peVar3->loopConditionEvalJumpIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (peVar3->loopConditionEvalJumpIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  auStack_48 = (undefined1  [8])p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_48,
             "onExitWhileStatementAstNode encountered while exit statement but loopConditionEvalJumpIndices is empty"
             ,"");
  Error::assertWithPanic(puVar4 != puVar5,(string *)auStack_48);
  if (auStack_48 != (undefined1  [8])p_Var1) {
    operator_delete((void *)auStack_48,
                    (ulong)((long)&(vec.
                                    super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  peVar3 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar4 = (peVar3->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (peVar3->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pp_Var12 = (_func_int **)((long)puVar5 - (long)puVar4 >> 3);
  if (puVar5 == puVar4) {
    pp_Var19 = (_func_int **)((long)pp_Var12 - 1);
  }
  else {
    puVar5 = (peVar3->loopConditionEvalJumpIndices).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = (peVar3->loopConditionEvalJumpIndices).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pp_Var14 = (_func_int **)((long)puVar6 - (long)puVar5 >> 3);
    if (puVar6 == puVar5) {
      pp_Var19 = (_func_int **)((long)pp_Var14 - 1);
      pp_Var12 = pp_Var14;
    }
    else {
      p_Var7 = (_Hash_node_base *)puVar4[(long)pp_Var12 - 1];
      pp_Var19 = (_func_int **)puVar5[(long)pp_Var14 - 1];
      uVar8 = (peVar3->breakStatementsForLoops)._M_h._M_bucket_count;
      uVar13 = (ulong)p_Var7 % uVar8;
      p_Var17 = (peVar3->breakStatementsForLoops)._M_h._M_buckets[uVar13];
      p_Var18 = (__node_base_ptr)0x0;
      if ((p_Var17 != (__node_base_ptr)0x0) &&
         (p_Var15 = p_Var17->_M_nxt, p_Var18 = p_Var17, p_Var7 != p_Var17->_M_nxt[1]._M_nxt)) {
        while (p_Var17 = p_Var15, p_Var15 = p_Var17->_M_nxt, p_Var15 != (_Hash_node_base *)0x0) {
          p_Var18 = (__node_base_ptr)0x0;
          if (((ulong)p_Var15[1]._M_nxt % uVar8 != uVar13) ||
             (p_Var18 = p_Var17, p_Var7 == p_Var15[1]._M_nxt)) goto LAB_0011c20a;
        }
        p_Var18 = (__node_base_ptr)0x0;
      }
LAB_0011c20a:
      if (p_Var18 == (__node_base_ptr)0x0) {
        p_Var15 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var15 = p_Var18->_M_nxt;
      }
      auStack_48 = (undefined1  [8])0x0;
      vec.
      super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      if (p_Var15 != (_Hash_node_base *)0x0) {
        auStack_48 = (undefined1  [8])p_Var15[2]._M_nxt;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&vec,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var15 + 3));
      }
      bc.parameter = (size_t)p_Var7;
      bc._0_8_ = 7;
      EmissionContext::EmitByteCode
                ((this->ec).
                 super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr,bc
                );
      peVar3 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pBVar9 = (peVar3->byteCode).
               super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
               super__Vector_impl_data._M_start;
      pp_Var12 = (_func_int **)
                 ((long)(peVar3->byteCode).
                        super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pBVar9 >> 4);
      if (pp_Var19 < pp_Var12) {
        *(_func_int ***)((long)(pBVar9 + (long)pp_Var19) + 8) = pp_Var12;
        if (auStack_48 != (undefined1  [8])0x0) {
          p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)auStack_48 + 8);
          for (_Var16._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)auStack_48;
              _Var16._M_pi != p_Var10;
              _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             &(_Var16._M_pi)->_M_use_count) {
            pp_Var19 = (_Var16._M_pi)->_vptr__Sp_counted_base;
            if (pp_Var12 <= pp_Var19) goto LAB_0011c2d3;
            *(_func_int ***)((long)(pBVar9 + (long)pp_Var19) + 8) = pp_Var12;
          }
        }
        ppuVar2 = &(peVar3->loopStartIndices).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar2 = *ppuVar2 + -1;
        ppuVar2 = &(peVar3->loopConditionEvalJumpIndices).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar2 = *ppuVar2 + -1;
        if (vec.
            super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     vec.
                     super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        }
        return;
      }
    }
  }
LAB_0011c2d3:
  uVar11 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                      pp_Var19,pp_Var12);
  __clang_call_terminate(uVar11);
}

Assistant:

void onExitWhileStatementAstNode(WhileStatementAstNode*  /*node*/) noexcept override {
    Error::assertWithPanic(!this->ec->loopStartIndices.empty(),
      "onExitWhileStatementAstNode encountered while exit statement but loopStartIndices is empty");

    Error::assertWithPanic(!this->ec->loopConditionEvalJumpIndices.empty(),
      "onExitWhileStatementAstNode encountered while exit statement but loopConditionEvalJumpIndices is empty");

    std::size_t loopStartIndex = this->ec->loopStartIndices.at(this->ec->loopStartIndices.size() - 1);
    std::size_t loopJumpIfFalseIndex = this->ec->loopConditionEvalJumpIndices.at(this->ec->loopConditionEvalJumpIndices.size() - 1);

    auto find = this->ec->breakStatementsForLoops.find(loopStartIndex);

    std::shared_ptr<std::vector<std::size_t>> vec = nullptr;

    if (find != this->ec->breakStatementsForLoops.end()) {
      vec = find->second;
    }

    this->emit(bytecode::ByteCodeInstruction::Jump, loopStartIndex);

    std::size_t loopEnd = this->ec->byteCode.size();

    this->ec->UpdateParameterAtIndex(loopJumpIfFalseIndex, loopEnd);

    if (vec != nullptr) {
      for (const auto breakIndex : *vec) {
        this->ec->UpdateParameterAtIndex(breakIndex, loopEnd);
      }
    }

    this->ec->loopStartIndices.pop_back();
    this->ec->loopConditionEvalJumpIndices.pop_back();
  }